

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddGroup.c
# Opt level: O3

int zddGroupSiftingUp(DdManager *table,int y,int xLow,Move **moves)

{
  DdHalfWord x;
  Move *pMVar1;
  Move *pMVar2;
  DdHalfWord x_00;
  uint uVar3;
  DdNode *pDVar4;
  uint uVar5;
  
  uVar5 = table->keysZ;
  x_00 = cuddZddNextLow(table,y);
  do {
    if ((int)x_00 < xLow) {
      return 1;
    }
    x = table->subtableZ[(int)x_00].next;
    if ((x == x_00) && (table->subtableZ[y].next == y)) {
      uVar3 = cuddZddSwapInPlace(table,x_00,y);
      if ((uVar3 == 0) || (pDVar4 = cuddDynamicAllocNode(table), pDVar4 == (DdNode *)0x0)) {
LAB_009386cf:
        pMVar2 = *moves;
        while (pMVar2 != (Move *)0x0) {
          pMVar1 = pMVar2->next;
          pMVar2->y = 0;
          *(DdNode **)&pMVar2->flags = table->nextFree;
          table->nextFree = (DdNode *)*moves;
          *moves = pMVar1;
          pMVar2 = pMVar1;
        }
        return 0;
      }
      pDVar4->index = x_00;
      pDVar4->ref = y;
      *(undefined4 *)&pDVar4->next = 0;
      *(uint *)((long)&pDVar4->next + 4) = uVar3;
      (pDVar4->type).kids.T = (DdNode *)*moves;
      *moves = (Move *)pDVar4;
    }
    else {
      uVar3 = zddGroupMove(table,x_00,y,moves);
      if (uVar3 == 0) goto LAB_009386cf;
    }
    if ((double)(int)uVar5 * table->maxGrowth < (double)(int)uVar3) {
      return 1;
    }
    if ((int)uVar3 < (int)uVar5) {
      uVar5 = uVar3;
    }
    x_00 = cuddZddNextLow(table,x);
    y = x;
  } while( true );
}

Assistant:

static int
zddGroupSiftingUp(
  DdManager * table,
  int  y,
  int  xLow,
  Move ** moves)
{
    Move *move;
    int  x;
    int  size;
    int  gxtop;
    int  limitSize;

    limitSize = table->keysZ;

    x = cuddZddNextLow(table,y);
    while (x >= xLow) {
        gxtop = table->subtableZ[x].next;
        if (table->subtableZ[x].next == (unsigned) x &&
            table->subtableZ[y].next == (unsigned) y) {
            /* x and y are self groups */
            size = cuddZddSwapInPlace(table,x,y);
#ifdef DD_DEBUG
            assert(table->subtableZ[x].next == (unsigned) x);
            assert(table->subtableZ[y].next == (unsigned) y);
#endif
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            move = (Move *)cuddDynamicAllocNode(table);
            if (move == NULL) goto zddGroupSiftingUpOutOfMem;
            move->x = x;
            move->y = y;
            move->flags = MTR_DEFAULT;
            move->size = size;
            move->next = *moves;
            *moves = move;

#ifdef DD_DEBUG
            if (pr > 0) (void) fprintf(table->out,"zddGroupSiftingUp (2 single groups):\n");
#endif
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        } else { /* group move */
            size = zddGroupMove(table,x,y,moves);
            if (size == 0) goto zddGroupSiftingUpOutOfMem;
            if ((double) size > (double) limitSize * table->maxGrowth)
                return(1);
            if (size < limitSize) limitSize = size;
        }
        y = gxtop;
        x = cuddZddNextLow(table,y);
    }

    return(1);

zddGroupSiftingUpOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}